

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  allocator local_61;
  string local_60;
  string local_40;
  
  LazyStat<Catch::TestRunInfo>::operator=
            (&(this->super_StreamingReporterBase).currentTestRunInfo,testInfo);
  (this->m_xml).m_os = (this->super_StreamingReporterBase).stream;
  std::__cxx11::string::string((string *)&local_60,"Catch",(allocator *)&local_40);
  XmlWriter::startElement(&this->m_xml,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
    _vptr_NonCopyable[6])(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (local_60._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_60,"name",&local_61);
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[6])(&local_40);
    XmlWriter::writeAttribute(&this->m_xml,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& testInfo ) {
            StreamingReporterBase::testRunStarting( testInfo );
            m_xml.setStream( stream );
            m_xml.startElement( "Catch" );
            if( !m_config->name().empty() )
                m_xml.writeAttribute( "name", m_config->name() );
        }